

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3MsrBufferData(Fts3MultiSegReader *pMsr,char *pList,i64 nList)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  u64 nBytes;
  
  if (pMsr->nBuffer < nList + 0x14) {
    pcVar3 = pMsr->aBuffer;
    nBytes = (u64)((int)nList * 2 + 0x14);
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      pcVar3 = (char *)sqlite3Realloc(pcVar3,nBytes);
    }
    else {
      pcVar3 = (char *)0x0;
    }
    if (pcVar3 == (char *)0x0) {
      return 7;
    }
    pMsr->aBuffer = pcVar3;
    pMsr->nBuffer = nBytes;
  }
  memcpy(pMsr->aBuffer,pList,nList);
  pcVar1 = pMsr->aBuffer;
  pcVar3 = pcVar1 + nList;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  pcVar3[8] = '\0';
  pcVar3[9] = '\0';
  pcVar3[10] = '\0';
  pcVar3[0xb] = '\0';
  pcVar3[0xc] = '\0';
  pcVar3[0xd] = '\0';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\0';
  pcVar1 = pcVar1 + nList + 0x10;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  return 0;
}

Assistant:

static int fts3MsrBufferData(
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  char *pList,
  i64 nList
){
  if( (nList+FTS3_NODE_PADDING)>pMsr->nBuffer ){
    char *pNew;
    int nNew = nList*2 + FTS3_NODE_PADDING;
    pNew = (char *)sqlite3_realloc64(pMsr->aBuffer, nNew);
    if( !pNew ) return SQLITE_NOMEM;
    pMsr->aBuffer = pNew;
    pMsr->nBuffer = nNew;
  }

  assert( nList>0 );
  memcpy(pMsr->aBuffer, pList, nList);
  memset(&pMsr->aBuffer[nList], 0, FTS3_NODE_PADDING);
  return SQLITE_OK;
}